

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleValueFromRatioT<float,float,float>
                (ImGuiDataType data_type,float t,float v_min,float v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float v_new_off_f;
  bool is_floating_point;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  float fStack_30;
  bool flipped;
  float v_max_fudged;
  float v_min_fudged;
  float result;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  float fStack_18;
  bool is_logarithmic_local;
  float v_max_local;
  float v_min_local;
  float t_local;
  ImGuiDataType data_type_local;
  
  t_local = v_min;
  if (0.0 < t) {
    if (((v_min != v_max) || (NAN(v_min) || NAN(v_max))) && (t_local = v_max, t < 1.0)) {
      v_max_fudged = 0.0;
      v_min_fudged = zero_deadzone_halfsize;
      result = logarithmic_zero_epsilon;
      zero_deadzone_halfsize_local._3_1_ = is_logarithmic;
      logarithmic_zero_epsilon_local = v_max;
      fStack_18 = v_min;
      v_max_local = t;
      v_min_local = (float)data_type;
      if (is_logarithmic) {
        fVar2 = ImAbs(v_min);
        if (result <= fVar2) {
          local_58 = fStack_18;
        }
        else {
          if (0.0 <= fStack_18) {
            local_54 = result;
          }
          else {
            local_54 = -result;
          }
          local_58 = local_54;
        }
        fStack_30 = local_58;
        fVar2 = ImAbs(logarithmic_zero_epsilon_local);
        if (result <= fVar2) {
          local_60 = logarithmic_zero_epsilon_local;
        }
        else {
          if (0.0 <= logarithmic_zero_epsilon_local) {
            local_5c = result;
          }
          else {
            local_5c = -result;
          }
          local_60 = local_5c;
        }
        t_with_flip = local_60;
        bVar1 = logarithmic_zero_epsilon_local < fStack_18;
        if (bVar1) {
          ImSwap<float>(&stack0xffffffffffffffd0,&t_with_flip);
        }
        fVar2 = fStack_30;
        if ((logarithmic_zero_epsilon_local == 0.0) && (fStack_18 < 0.0)) {
          t_with_flip = -result;
        }
        if (bVar1) {
          local_64 = 1.0 - v_max_local;
        }
        else {
          local_64 = v_max_local;
        }
        if (0.0 <= fStack_18 * logarithmic_zero_epsilon_local) {
          if ((fStack_18 < 0.0) || (logarithmic_zero_epsilon_local < 0.0)) {
            fVar2 = -t_with_flip;
            fVar3 = ImPow(-fStack_30 / -t_with_flip,1.0 - local_64);
            v_max_fudged = -(fVar2 * fVar3);
          }
          else {
            fVar3 = ImPow(t_with_flip / fStack_30,local_64);
            v_max_fudged = fVar2 * fVar3;
          }
        }
        else {
          fVar3 = ImMin<float>(fStack_18,logarithmic_zero_epsilon_local);
          fVar4 = ImAbs(logarithmic_zero_epsilon_local - fStack_18);
          fVar2 = result;
          fVar4 = -fVar3 / fVar4;
          fVar3 = fVar4 + v_min_fudged;
          if ((local_64 < fVar4 - v_min_fudged) || (fVar3 < local_64)) {
            if (fVar4 <= local_64) {
              fVar3 = ImPow(t_with_flip / result,(local_64 - fVar3) / (1.0 - fVar3));
              v_max_fudged = fVar2 * fVar3;
            }
            else {
              fVar3 = ImPow(-fStack_30 / result,1.0 - local_64 / (fVar4 - v_min_fudged));
              v_max_fudged = -(fVar2 * fVar3);
            }
          }
          else {
            v_max_fudged = 0.0;
          }
        }
      }
      else if (data_type == 8 || data_type == 9) {
        v_max_fudged = ImLerp<float>(v_min,v_max,t);
      }
      else if (t < 1.0) {
        fVar2 = -0.5;
        if (v_min <= v_max) {
          fVar2 = 0.5;
        }
        v_max_fudged = v_min + (v_max - v_min) * t + fVar2;
      }
      t_local = v_max_fudged;
    }
  }
  return t_local;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    // We special-case the extents because otherwise our logarithmic fudging can lead to "mathematically correct"
    // but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value. Also generally simpler.
    if (t <= 0.0f || v_min == v_max)
        return v_min;
    if (t >= 1.0f)
        return v_max;

    TYPE result = (TYPE)0;
    if (is_logarithmic)
    {
        // Fudge min/max to avoid getting silly results close to zero
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        const bool flipped = v_max < v_min; // Check if range is "backwards"
        if (flipped)
            ImSwap(v_min_fudged, v_max_fudged);

        // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

        if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
        {
            float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
            else if (t_with_flip < zero_point_center)
                result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
            else
                result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
        else
            result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
    }
    else
    {
        // Linear slider
        const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else if (t < 1.0)
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
            result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
        }
    }

    return result;
}